

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::
Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::update_value(Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               *this)

{
  int *piVar1;
  pointer pvVar2;
  pointer puVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *p;
  pointer pvVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var5
  ;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  uint uVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *part;
  uint j_1;
  uint j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> range;
  undefined8 local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  value_t *local_40;
  ulong local_38;
  
  local_40 = &this->value_;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_40->vertex_,(vector<int,_std::allocator<int>_> *)this);
  pvVar2 = (this->value_).partition_.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (this->value_).partition_.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar2; pvVar4 = pvVar4 + 1) {
    puVar3 = (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
  }
  local_5c = 0;
  while( true ) {
    if ((this->i_it_).value_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_start[this->k_] < local_5c) break;
    Ordered_set_partition::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
               &(this->o_its_).
                super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                ._M_impl.super__Vector_impl_data._M_start[this->k_].value_,&local_5c);
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      (local_58._M_impl.super__Vector_impl_data._M_start,
                       local_58._M_impl.super__Vector_impl_data._M_finish,&this->t_);
    puVar6 = local_58._M_impl.super__Vector_impl_data._M_finish;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
    if (_Var5._M_current != puVar6) break;
    local_5c = local_5c + 1;
  }
  uVar11 = 0;
  local_60 = local_5c;
  while( true ) {
    local_60 = local_60 + 1;
    uVar8 = (ulong)this->k_;
    puVar6 = (this->i_it_).value_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar6[uVar8] < local_60) break;
    Ordered_set_partition::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
               &(this->o_its_).
                super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].value_,&local_60);
    puVar6 = local_58._M_impl.super__Vector_impl_data._M_finish;
    local_64 = uVar11;
    for (puVar10 = local_58._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar6;
        puVar10 = puVar10 + 1) {
      uVar8 = (ulong)*(uint *)(*(long *)&(this->simplex_).partition_.
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[this->k_].
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data + (ulong)*puVar10 * 8);
      local_70 = uVar8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((this->value_).partition_.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11,&local_70);
      piVar1 = (local_40->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8;
      *piVar1 = *piVar1 + -1;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
    uVar11 = local_64 + 1;
  }
  uVar9 = 0;
  while (uVar9 < uVar8) {
    local_70 = (ulong)local_70._4_4_ << 0x20;
    uVar7 = 0;
    local_40 = (value_t *)(uVar9 * 0x138);
    local_38 = uVar9;
    while (uVar7 <= puVar6[local_38]) {
      Ordered_set_partition::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
                 (Ordered_set_partition *)
                 ((long)&(((this->o_its_).
                           super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                           ._M_impl.super__Vector_impl_data._M_start)->s_end_).value_.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 + (long)(local_40 + 3) + 8),(uint *)&local_70);
      puVar6 = local_58._M_impl.super__Vector_impl_data._M_finish;
      local_64 = uVar11;
      for (puVar10 = local_58._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar6;
          puVar10 = puVar10 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((this->value_).partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11,
                   (value_type_conflict2 *)
                   ((ulong)*puVar10 * 8 +
                   *(long *)&(this->simplex_).partition_.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar9].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data));
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
      uVar7 = (uint)local_70 + 1;
      local_70 = CONCAT44(local_70._4_4_,uVar7);
      uVar11 = local_64 + 1;
      puVar6 = (this->i_it_).value_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    uVar8 = (ulong)this->k_;
    uVar9 = local_38 + 1;
  }
  local_70 = (ulong)local_70._4_4_ << 0x20;
  uVar7 = 0;
  while (uVar7 <= local_5c) {
    Ordered_set_partition::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
               &(this->o_its_).
                super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                ._M_impl.super__Vector_impl_data._M_start[this->k_].value_,(uint *)&local_70);
    puVar6 = local_58._M_impl.super__Vector_impl_data._M_finish;
    for (puVar10 = local_58._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar6;
        puVar10 = puVar10 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((this->value_).partition_.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11,
                 (value_type_conflict2 *)
                 ((ulong)*puVar10 * 8 +
                 *(long *)&(this->simplex_).partition_.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[this->k_].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data));
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
    uVar7 = (uint)local_70 + 1;
    local_70 = CONCAT44(local_70._4_4_,uVar7);
    uVar11 = uVar11 + 1;
  }
  pvVar2 = (this->value_).partition_.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (this->value_).partition_.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar2; pvVar4 = pvVar4 + 1) {
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void update_value() {
    value_.vertex() = simplex_.vertex();
    for (auto& p : value_.partition()) p.clear();
    uint u_ = 0;  // the part in o_its_[k_] that contains t_
    for (; u_ <= (*i_it_)[k_]; u_++) {
      auto range = (*o_its_[k_])[u_];
      if (std::find(range.begin(), range.end(), t_) != range.end()) break;
    }
    uint i = 0;
    for (uint j = u_ + 1; j <= (*i_it_)[k_]; j++, i++)
      for (uint b : (*o_its_[k_])[j]) {
        uint c = simplex_.partition()[k_][b];
        value_.partition()[i].push_back(c);
        value_.vertex()[c]--;
      }
    for (uint h = 0; h < k_; h++)
      for (uint j = 0; j <= (*i_it_)[h]; j++, i++) {
        for (uint b : (*o_its_[h])[j]) value_.partition()[i].push_back(simplex_.partition()[h][b]);
      }
    for (uint j = 0; j <= u_; j++, i++)
      for (uint b : (*o_its_[k_])[j]) value_.partition()[i].push_back(simplex_.partition()[k_][b]);
    // sort the values in each part (probably not needed)
    for (auto& part : value_.partition()) std::sort(part.begin(), part.end());
  }